

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void groupConcatStep(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  u8 uVar1;
  sqlite3 *psVar2;
  int iVar3;
  StrAccum *p;
  char *z;
  uchar *z_00;
  
  if ((*argv)->type != '\x05') {
    p = (StrAccum *)sqlite3_aggregate_context(context,0x28);
    if (p != (StrAccum *)0x0) {
      uVar1 = p->useMalloc;
      psVar2 = (context->s).db;
      p->useMalloc = '\x02';
      p->mxAlloc = psVar2->aLimit[0];
      if (uVar1 != '\0') {
        if (argc == 2) {
          z = (char *)sqlite3_value_text(argv[1]);
          iVar3 = sqlite3_value_bytes(argv[1]);
        }
        else {
          z = ",";
          iVar3 = 1;
        }
        sqlite3StrAccumAppend(p,z,iVar3);
      }
      z_00 = sqlite3_value_text(*argv);
      iVar3 = sqlite3_value_bytes(*argv);
      sqlite3StrAccumAppend(p,(char *)z_00,iVar3);
      return;
    }
  }
  return;
}

Assistant:

static void groupConcatStep(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const char *zVal;
  StrAccum *pAccum;
  const char *zSep;
  int nVal, nSep;
  assert( argc==1 || argc==2 );
  if( sqlite3_value_type(argv[0])==SQLITE_NULL ) return;
  pAccum = (StrAccum*)sqlite3_aggregate_context(context, sizeof(*pAccum));

  if( pAccum ){
    sqlite3 *db = sqlite3_context_db_handle(context);
    int firstTerm = pAccum->useMalloc==0;
    pAccum->useMalloc = 2;
    pAccum->mxAlloc = db->aLimit[SQLITE_LIMIT_LENGTH];
    if( !firstTerm ){
      if( argc==2 ){
        zSep = (char*)sqlite3_value_text(argv[1]);
        nSep = sqlite3_value_bytes(argv[1]);
      }else{
        zSep = ",";
        nSep = 1;
      }
      sqlite3StrAccumAppend(pAccum, zSep, nSep);
    }
    zVal = (char*)sqlite3_value_text(argv[0]);
    nVal = sqlite3_value_bytes(argv[0]);
    sqlite3StrAccumAppend(pAccum, zVal, nVal);
  }
}